

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  pointer *ppbVar1;
  cmMakefile *mf;
  cmGlobalGenerator *pcVar2;
  pointer pbVar3;
  ostream *poVar4;
  cmMakefile *pcVar5;
  pointer ppcVar6;
  cmLocalGenerator *pcVar7;
  pointer puVar8;
  pointer pcVar9;
  cmGeneratorTarget *pcVar10;
  size_t __n;
  cmake *pcVar11;
  cmSourceFile *this_00;
  cmMakefile *this_01;
  pointer pbVar12;
  _Base_ptr p_Var13;
  pointer ppcVar14;
  pointer ppcVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  TargetType TVar21;
  _Rb_tree_header *p_Var22;
  string *psVar23;
  long lVar24;
  _Rb_tree_node_base *p_Var25;
  string *psVar26;
  pointer ppcVar27;
  string *psVar28;
  string *psVar29;
  const_iterator cVar30;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_02;
  iterator iVar31;
  mapped_type *__x;
  mapped_type *this_03;
  _Base_ptr p_Var32;
  pointer filename_00;
  pointer puVar33;
  pointer pbVar34;
  _Base_ptr p_Var35;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string fileName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string targetName;
  string compiler;
  string headerBasename;
  cmXMLWriter xml;
  all_files_map_t allFiles;
  string local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  Tree tree;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tree.files._M_t._M_impl.super__Rb_tree_header._M_header;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var25 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var22 = &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
    tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tree.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var25 != p_Var22) {
      do {
        allFiles._M_t._M_impl._0_8_ = 0;
        allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        allFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var35 = p_Var25[2]._M_parent;
        for (p_Var32 = *(_Base_ptr *)(p_Var25 + 2);
            uVar17 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
            psVar26 = (string *)allFiles._M_t._M_impl._0_8_, p_Var32 != p_Var35;
            p_Var32 = (_Base_ptr)&p_Var32->_M_parent) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&allFiles,
                     allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                     *(undefined8 *)(*(long *)(*(long *)p_Var32 + 0x70) + 0x1e8));
        }
        for (; psVar26 != (string *)uVar17; psVar26 = psVar26 + 1) {
          pbVar3 = (pointer)(psVar26->_M_dataplus)._M_p;
          poVar4 = (ostream *)psVar26->_M_string_length;
          psVar23 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
          __str._M_str = (psVar23->_M_dataplus)._M_p;
          __str._M_len = psVar23->_M_string_length;
          xml.Output = poVar4;
          xml.Elements.c.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar3;
          iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)&xml,0,
                              psVar23->_M_string_length,__str);
          if (iVar20 != 0) {
            psVar23 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                                ((cmLocalGenerator *)**(undefined8 **)(p_Var25 + 2));
            cmSystemTools::RelativePath((string *)&xml,psVar23,psVar26);
            compiler._M_dataplus._M_p = (pointer)0x0;
            compiler._M_string_length = 0;
            compiler.field_2._M_allocated_capacity = 0;
            cmsys::SystemTools::SplitPath
                      ((string *)&xml,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&compiler,false);
            fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&fileName,*(long *)(compiler._M_string_length - 0x20),
                       *(long *)(compiler._M_string_length - 0x18) +
                       *(long *)(compiler._M_string_length - 0x20));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&compiler,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (compiler._M_string_length - 0x20),(iterator)compiler._M_string_length);
            pcVar5 = *(cmMakefile **)(**(long **)(p_Var25 + 2) + 0x70);
            targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&targetName,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES","");
            bVar18 = cmMakefile::IsOn(pcVar5,&targetName);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetName._M_dataplus._M_p != &targetName.field_2) {
              operator_delete(targetName._M_dataplus._M_p,
                              targetName.field_2._M_allocated_capacity + 1);
            }
            if ((compiler._M_dataplus._M_p != (pointer)compiler._M_string_length) &&
               (((!bVar18 ||
                 (lVar24 = std::__cxx11::string::find((char *)&xml,0x8faf30,0), lVar24 == -1)) &&
                (lVar24 = std::__cxx11::string::find((char *)&xml,0x8ab77b,0), lVar24 == -1)))) {
              Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&compiler,1,&fileName);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fileName._M_dataplus._M_p != &fileName.field_2) {
              operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&compiler);
            if (xml.Output !=
                (ostream *)
                &xml.Elements.c.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete(xml.Output,
                              (ulong)((long)&((xml.Elements.c.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus)._M_p + 1));
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&allFiles);
        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
      } while ((_Rb_tree_header *)p_Var25 != p_Var22);
    }
    GetCBCompilerId_abi_cxx11_(&compiler,this,mf);
    ppbVar1 = &xml.Elements.c.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    xml.Output = (ostream *)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&xml,"CMAKE_MAKE_PROGRAM","");
    psVar26 = cmMakefile::GetRequiredDefinition(mf,(string *)&xml);
    if (xml.Output != (ostream *)ppbVar1) {
      operator_delete(xml.Output,
                      (ulong)((long)&((xml.Elements.c.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + 1));
    }
    xml.Output = (ostream *)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&xml,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS","");
    psVar23 = cmMakefile::GetSafeDefinition(mf,(string *)&xml);
    if (xml.Output != (ostream *)ppbVar1) {
      operator_delete(xml.Output,
                      (ulong)((long)&((xml.Elements.c.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + 1));
    }
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"UTF-8");
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fileName,"CodeBlocks_project_file","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"FileVersion","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    fileName._M_dataplus._M_p._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"major",(int *)&fileName);
    fileName._M_dataplus._M_p._0_4_ = 6;
    cmXMLWriter::Attribute<int>(&xml,"minor",(int *)&fileName);
    cmXMLWriter::EndElement(&xml);
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Project","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Option","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::GetProjectName_abi_cxx11_
              (&fileName,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"title",&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::EndElement(&xml);
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Option","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    fileName._M_dataplus._M_p._0_4_ = 1;
    cmXMLWriter::Attribute<int>(&xml,"makefile_is_custom",(int *)&fileName);
    cmXMLWriter::EndElement(&xml);
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Option","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"compiler",&compiler);
    cmXMLWriter::EndElement(&xml);
    Tree::BuildVirtualFolder(&tree,&xml);
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Build","");
    cmXMLWriter::StartElement(&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"all","");
    AppendTarget(this,&xml,&fileName,(cmGeneratorTarget *)0x0,psVar26,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,&compiler,psVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    ppcVar27 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppcVar6 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar27 != ppcVar6) {
      do {
        pcVar7 = *ppcVar27;
        puVar8 = (pcVar7->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar33 = (pcVar7->GeneratorTargets).
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar8;
            puVar33 = puVar33 + 1) {
          psVar28 = cmGeneratorTarget::GetName_abi_cxx11_
                              ((puVar33->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
          pcVar9 = (psVar28->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&targetName,pcVar9,pcVar9 + psVar28->_M_string_length);
          TVar21 = cmGeneratorTarget::GetType
                             ((puVar33->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (TVar21 < UTILITY) {
            pcVar10 = (puVar33->_M_t).
                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                      .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            AppendTarget(this,&xml,&targetName,pcVar10,psVar26,pcVar7,&compiler,psVar23);
            fileName._M_dataplus._M_p = (pointer)targetName._M_string_length;
            fileName._M_string_length = (size_type)targetName._M_dataplus._M_p;
            fileName.field_2._M_allocated_capacity = 0;
            fileName.field_2._8_8_ = 5;
            views._M_len = 2;
            views._M_array = (iterator)&fileName;
            cmCatViews((string *)&allFiles,views);
            AppendTarget(this,&xml,(string *)&allFiles,pcVar10,psVar26,pcVar7,&compiler,psVar23);
            if ((_Base_ptr *)allFiles._M_t._M_impl._0_8_ !=
                &allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)allFiles._M_t._M_impl._0_8_,
                              (ulong)((long)&(allFiles._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          else if (TVar21 == UTILITY) {
            fileName._M_dataplus._M_p = (pointer)targetName._M_string_length;
            fileName._M_string_length = (size_type)targetName._M_dataplus._M_p;
            __str_00._M_str = "Nightly";
            __str_00._M_len = 7;
            iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)&fileName,0,7,
                                __str_00);
            if ((iVar20 != 0) ||
               (iVar20 = std::__cxx11::string::compare((char *)&targetName), iVar20 == 0)) {
              fileName._M_dataplus._M_p = (pointer)targetName._M_string_length;
              fileName._M_string_length = (size_type)targetName._M_dataplus._M_p;
              __str_01._M_str = "Continuous";
              __str_01._M_len = 10;
              iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&fileName,0,10
                                  ,__str_01);
              if ((iVar20 != 0) ||
                 (iVar20 = std::__cxx11::string::compare((char *)&targetName), iVar20 == 0)) {
                fileName._M_dataplus._M_p = (pointer)targetName._M_string_length;
                fileName._M_string_length = (size_type)targetName._M_dataplus._M_p;
                __str_02._M_str = "Experimental";
                __str_02._M_len = 0xc;
                iVar20 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&fileName,0,
                                    0xc,__str_02);
                if (iVar20 == 0) {
                  iVar20 = std::__cxx11::string::compare((char *)&targetName);
                  goto LAB_00518d6d;
                }
                goto LAB_00518d71;
              }
            }
          }
          else if (TVar21 == GLOBAL_TARGET) {
            psVar28 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar7);
            psVar29 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar7);
            __n = psVar28->_M_string_length;
            if (__n == psVar29->_M_string_length) {
              if (__n != 0) {
                iVar20 = bcmp((psVar28->_M_dataplus)._M_p,(psVar29->_M_dataplus)._M_p,__n);
LAB_00518d6d:
                if (iVar20 != 0) goto LAB_00518dd2;
              }
LAB_00518d71:
              AppendTarget(this,&xml,&targetName,(cmGeneratorTarget *)0x0,psVar26,pcVar7,&compiler,
                           psVar23);
            }
          }
LAB_00518dd2:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetName._M_dataplus._M_p != &targetName.field_2) {
            operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1
                           );
          }
        }
        ppcVar27 = ppcVar27 + 1;
      } while (ppcVar27 != ppcVar6);
    }
    cmXMLWriter::EndElement(&xml);
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppcVar27 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppcVar6 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar27 != ppcVar6) {
      pcVar11 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
      do {
        pcVar7 = *ppcVar27;
        puVar33 = (pcVar7->GeneratorTargets).
                  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar8 = (pcVar7->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar33 != puVar8) {
          pcVar5 = pcVar7->Makefile;
          do {
            TVar21 = cmGeneratorTarget::GetType
                               ((puVar33->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            if (TVar21 < GLOBAL_TARGET) {
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pcVar10 = (puVar33->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                        .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
              fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&fileName,"CMAKE_BUILD_TYPE","");
              psVar26 = cmMakefile::GetSafeDefinition(pcVar5,&fileName);
              cmGeneratorTarget::GetSourceFiles(pcVar10,&sources,psVar26);
              ppcVar14 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppcVar15 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fileName._M_dataplus._M_p != &fileName.field_2) {
                operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1
                               );
                ppcVar14 = sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                ppcVar15 = sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              }
              for (; ppcVar16 = sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                  ppcVar14 !=
                  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
                this_00 = *ppcVar14;
                sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish = ppcVar15;
                TVar21 = cmGeneratorTarget::GetType
                                   ((puVar33->_M_t).
                                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                    .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)
                ;
                if ((TVar21 != UTILITY) ||
                   (bVar18 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal), !bVar18)) {
                  psVar26 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(this_00);
                  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
                  pcVar9 = (psVar26->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&fileName,pcVar9,pcVar9 + psVar26->_M_string_length);
                  iVar20 = std::__cxx11::string::compare((char *)&fileName);
                  if ((iVar20 == 0) ||
                     (((iVar20 = std::__cxx11::string::compare((char *)&fileName), iVar20 == 0 ||
                       (iVar20 = std::__cxx11::string::compare((char *)&fileName), iVar20 == 0)) ||
                      (iVar20 = std::__cxx11::string::compare((char *)&fileName), iVar20 == 0)))) {
                    psVar26 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                    targetName._M_string_length = (size_type)(psVar26->_M_dataplus)._M_p;
                    targetName._M_dataplus._M_p = (pointer)psVar26->_M_string_length;
                    cVar30 = std::
                             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             ::find(&(pcVar11->CLikeSourceFileExtensions).unordered._M_h,
                                    (key_type *)&targetName);
                    bVar18 = cVar30.
                             super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                             ._M_cur != (__node_type *)0x0;
                  }
                  else {
                    bVar18 = false;
                  }
                  psVar26 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
                  psVar23 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar7);
                  cmSystemTools::RelativePath(&targetName,psVar23,psVar26);
                  this_01 = pcVar7->Makefile;
                  headerBasename._M_dataplus._M_p = (pointer)&headerBasename.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&headerBasename,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES","")
                  ;
                  bVar19 = cmMakefile::IsOn(this_01,&headerBasename);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)headerBasename._M_dataplus._M_p != &headerBasename.field_2) {
                    operator_delete(headerBasename._M_dataplus._M_p,
                                    headerBasename.field_2._M_allocated_capacity + 1);
                  }
                  if ((!bVar19) ||
                     (lVar24 = std::__cxx11::string::find((char *)&targetName,0x8faf30,0),
                     lVar24 == -1)) {
                    if (bVar18) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&cFiles,psVar26);
                    }
                    this_02 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                               *)std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                 ::operator[](&allFiles,psVar26);
                    headerBasename._M_dataplus._M_p =
                         (pointer)(puVar33->_M_t).
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
                    std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
                    emplace_back<cmGeneratorTarget_const*>
                              (this_02,(cmGeneratorTarget **)&headerBasename);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)targetName._M_dataplus._M_p != &targetName.field_2) {
                    operator_delete(targetName._M_dataplus._M_p,
                                    targetName.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)fileName._M_dataplus._M_p != &fileName.field_2) {
                    operator_delete(fileName._M_dataplus._M_p,
                                    fileName.field_2._M_allocated_capacity + 1);
                  }
                }
                ppcVar15 = sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish = ppcVar16;
              }
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = ppcVar15;
              if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)sources.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)sources.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            puVar33 = puVar33 + 1;
          } while (puVar33 != puVar8);
        }
        ppcVar27 = ppcVar27 + 1;
      } while (ppcVar27 != ppcVar6);
    }
    pbVar3 = cFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar11 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
      filename_00 = cFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath((string *)&sources,filename_00);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_358,filename_00);
        fileName._M_dataplus._M_p =
             (pointer)sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        fileName._M_string_length =
             (size_type)
             sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        targetName._M_dataplus._M_p = (pointer)0x0;
        targetName._M_string_length = 1;
        targetName.field_2._M_allocated_capacity = (long)&targetName.field_2 + 8;
        targetName.field_2._M_local_buf[8] = '/';
        fileName.field_2._8_8_ = 1;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&fileName;
        fileName.field_2._M_allocated_capacity = (size_type)(string *)&sources;
        cmCatViews(&headerBasename,views_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        pbVar12 = (pcVar11->HeaderFileExtensions).ordered.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar34 = (pcVar11->HeaderFileExtensions).ordered.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar34 != pbVar12;
            pbVar34 = pbVar34 + 1) {
          fileName._M_dataplus._M_p = (pointer)headerBasename._M_string_length;
          fileName._M_string_length = (size_type)headerBasename._M_dataplus._M_p;
          fileName.field_2._M_allocated_capacity = 0;
          targetName._M_dataplus._M_p = (pointer)0x0;
          targetName._M_string_length = 1;
          targetName.field_2._M_allocated_capacity = (long)&targetName.field_2 + 8;
          targetName.field_2._M_local_buf[8] = '.';
          fileName.field_2._8_8_ = 1;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&fileName;
          cmCatViews((string *)&sources,views_01);
          iVar31 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                   ::find(&allFiles._M_t,(string *)&sources);
          if ((_Rb_tree_header *)iVar31._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00519438:
            if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(sources.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            break;
          }
          bVar18 = cmsys::SystemTools::FileExists((string *)&sources);
          if (bVar18) {
            __x = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  ::operator[](&allFiles,filename_00);
            this_03 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[](&allFiles,(string *)&sources);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_03->Targets,&__x->Targets);
            goto LAB_00519438;
          }
          if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)sources.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)headerBasename._M_dataplus._M_p != &headerBasename.field_2) {
          operator_delete(headerBasename._M_dataplus._M_p,
                          headerBasename.field_2._M_allocated_capacity + 1);
        }
        filename_00 = filename_00 + 1;
      } while (filename_00 != pbVar3);
    }
    if ((_Rb_tree_header *)allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &allFiles._M_t._M_impl.super__Rb_tree_header) {
      p_Var32 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Unit","");
        cmXMLWriter::StartElement(&xml,&fileName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileName._M_dataplus._M_p != &fileName.field_2) {
          operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&xml,"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var32 + 1));
        p_Var13 = p_Var32[2]._M_parent;
        for (p_Var35 = *(_Base_ptr *)(p_Var32 + 2); p_Var35 != p_Var13;
            p_Var35 = (_Base_ptr)&p_Var35->_M_parent) {
          pcVar10 = *(cmGeneratorTarget **)p_Var35;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&fileName,"Option","");
          cmXMLWriter::StartElement(&xml,&fileName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
          }
          psVar26 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar10);
          cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"target",psVar26);
          cmXMLWriter::EndElement(&xml);
        }
        cmXMLWriter::EndElement(&xml);
        p_Var32 = (_Base_ptr)std::_Rb_tree_increment(p_Var32);
      } while ((_Rb_tree_header *)p_Var32 != &allFiles._M_t._M_impl.super__Rb_tree_header);
    }
    psVar26 = cmMakefile::GetHomeDirectory_abi_cxx11_(mf);
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    pcVar9 = (psVar26->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fileName,pcVar9,pcVar9 + psVar26->_M_string_length);
    std::__cxx11::string::append((char *)&fileName);
    Tree::BuildUnit(&tree,&xml,&fileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndElement(&xml);
    cmXMLWriter::EndDocument(&xml);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    cmXMLWriter::~cmXMLWriter(&xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compiler._M_dataplus._M_p != &compiler.field_2) {
      operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&tree.files._M_t);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&tree.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tree.path._M_dataplus._M_p != &tree.path.field_2) {
      operator_delete(tree.path._M_dataplus._M_p,
                      CONCAT71(tree.path.field_2._M_allocated_capacity._1_7_,
                               tree.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (cmLocalGenerator* lg : it.second) {
      cm::append(listFiles, lg->GetMakefile()->GetListFiles());
    }

    // Convert
    for (std::string const& listFile : listFiles) {
      // don't put cmake's own files into the project (#12110):
      if (cmHasPrefix(listFile, cmSystemTools::GetCMakeRoot())) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it.second[0]->GetSourceDirectory(), listFile);
      std::vector<std::string> split;
      cmSystemTools::SplitPath(relative, split, false);
      // Split filename from path
      std::string fileName = *(split.end() - 1);
      split.erase(split.end() - 1, split.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      //
      // Also we can disable external (outside the project) files by setting ON
      // CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable.
      const bool excludeExternal = it.second[0]->GetMakefile()->IsOn(
        "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
      if (!split.empty() &&
          (!excludeExternal || (relative.find("..") == std::string::npos)) &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(split, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", nullptr, make, lgs[0], compiler, makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                               makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, nullptr, make, lg, compiler,
                             makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = target.get();
          this->AppendTarget(xml, targetName, gt, make, lg, compiler,
                             makeArgs);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(xml, fastTarget, gt, make, lg, compiler,
                             makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an accompanying header
  // that should be looked for.
  using all_files_map_t = std::map<std::string, CbpUnit>;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  auto* cm = this->GlobalGenerator->GetCMakeInstance();

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          target->GetSourceFiles(
            sources, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* s : sources) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (target->GetType() == cmStateEnums::UTILITY &&
                s->GetIsGenerated()) {
              continue;
            }

            // check whether it is a C/C++/CUDA/HIP implementation file
            bool isCFile = false;
            std::string lang = s->GetOrDetermineLanguage();
            if (lang == "C" || lang == "CXX" || lang == "CUDA" ||
                lang == "HIP") {
              std::string const& srcext = s->GetExtension();
              isCFile = cm->IsACLikeSourceExtension(srcext);
            }

            std::string const& fullPath = s->ResolveFullPath();

            // Check file position relative to project root dir.
            const std::string relative =
              cmSystemTools::RelativePath(lg->GetSourceDirectory(), fullPath);
            // Do not add this file if it has ".." in relative path and
            // if CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable is on.
            const bool excludeExternal = lg->GetMakefile()->IsOn(
              "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES");
            if (excludeExternal &&
                (relative.find("..") != std::string::npos)) {
              continue;
            }

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(target.get());
          }
        } break;
        default:
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeLite
  // project generator.
  for (std::string const& fileName : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(fileName), '/',
               cmSystemTools::GetFilenameWithoutExtension(fileName));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (auto const& s : allFiles) {
    std::string const& unitFilename = s.first;
    CbpUnit const& unit = s.second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (cmGeneratorTarget const* tgt : unit.Targets) {
      xml.StartElement("Option");
      xml.Attribute("target", tgt->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, mf->GetHomeDirectory() + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}